

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_attribute_corner_table.cc
# Opt level: O1

bool __thiscall
draco::MeshAttributeCornerTable::RecomputeVerticesInternal<false>
          (MeshAttributeCornerTable *this,Mesh *mesh,PointAttribute *att)

{
  uint uVar1;
  pointer pIVar2;
  iterator iVar3;
  iterator iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  pointer pIVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  CornerIndex first_c;
  AttributeValueIndex first_vert_id;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_44;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_40;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_3c;
  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
  *local_38;
  
  pIVar2 = (this->vertex_to_attribute_entry_id_map_).
           super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->vertex_to_attribute_entry_id_map_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar2) {
    (this->vertex_to_attribute_entry_id_map_).
    super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar2;
  }
  pIVar8 = (this->vertex_to_left_most_corner_map_).
           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->vertex_to_left_most_corner_map_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar8) {
    (this->vertex_to_left_most_corner_map_).
    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar8;
  }
  pIVar8 = (this->corner_table_->vertex_corners_).vector_.
           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar12 = (int)((ulong)((long)(this->corner_table_->vertex_corners_).vector_.
                               super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar8) >> 2) == 0
  ;
  if (!bVar12) {
    local_38 = (vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                *)&this->vertex_to_left_most_corner_map_;
    uVar10 = 0;
    uVar9 = 0;
    do {
      uVar1 = pIVar8[uVar10].value_;
      if (uVar1 == 0xffffffff) {
        bVar11 = false;
      }
      else {
        iVar3._M_current =
             (this->vertex_to_attribute_entry_id_map_).
             super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_3c.value_ = uVar9;
        if (iVar3._M_current ==
            (this->vertex_to_attribute_entry_id_map_).
            super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>>
          ::
          _M_realloc_insert<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>const&>
                    ((vector<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>>
                      *)&this->vertex_to_attribute_entry_id_map_,iVar3,&local_3c);
        }
        else {
          (iVar3._M_current)->value_ = uVar9;
          (this->vertex_to_attribute_entry_id_map_).
          super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        uVar9 = uVar9 + 1;
        local_44.value_ = 0;
        local_40.value_ = uVar1;
        if (((this->is_vertex_on_seam_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar10 >> 6] >>
             (uVar10 & 0x3f) & 1) == 0) {
LAB_0014ad43:
          (this->corner_to_vertex_map_).
          super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[local_40.value_].value_ = local_3c.value_;
          iVar4._M_current =
               (this->vertex_to_left_most_corner_map_).
               super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->vertex_to_left_most_corner_map_).
              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
            ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                      (local_38,iVar4,&local_40);
          }
          else {
            (iVar4._M_current)->value_ = local_40.value_;
            (this->vertex_to_left_most_corner_map_).
            super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
          }
          local_44.value_ = local_40.value_;
          if (local_40.value_ != 0xffffffff) {
            local_44.value_ =
                 ((local_40.value_ * -0x55555555 < 0x55555556) - 1 | 2) + local_40.value_;
          }
          if (local_44.value_ != 0xffffffff) {
            local_44.value_ =
                 (this->corner_table_->opposite_corners_).vector_.
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_44.value_].value_;
          }
          if (local_44.value_ != 0xffffffff) {
            local_44.value_ =
                 ((local_44.value_ * -0x55555555 < 0x55555556) - 1 | 2) + local_44.value_;
          }
          bVar11 = false;
          while ((local_44.value_ != 0xffffffff && (local_44.value_ != local_40.value_))) {
            uVar1 = local_44.value_ - 2;
            if (0x55555555 < (local_44.value_ + 1) * -0x55555555) {
              uVar1 = local_44.value_ + 1;
            }
            if ((*(ulong *)((long)(this->is_edge_on_seam_).
                                  super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           (ulong)(uVar1 >> 6) * 8) >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
              iVar3._M_current =
                   (this->vertex_to_attribute_entry_id_map_).
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_3c.value_ = uVar9;
              if (iVar3._M_current ==
                  (this->vertex_to_attribute_entry_id_map_).
                  super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>>
                ::
                _M_realloc_insert<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>const&>
                          ((vector<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>>
                            *)&this->vertex_to_attribute_entry_id_map_,iVar3,&local_3c);
              }
              else {
                (iVar3._M_current)->value_ = uVar9;
                (this->vertex_to_attribute_entry_id_map_).
                super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
              }
              uVar9 = uVar9 + 1;
              iVar4._M_current =
                   (this->vertex_to_left_most_corner_map_).
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  (this->vertex_to_left_most_corner_map_).
                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                ::
                _M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                          (local_38,iVar4,&local_44);
              }
              else {
                (iVar4._M_current)->value_ = local_44.value_;
                (this->vertex_to_left_most_corner_map_).
                super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
              }
            }
            (this->corner_to_vertex_map_).
            super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[local_44.value_].value_ = local_3c.value_;
            if (local_44.value_ != 0xffffffff) {
              local_44.value_ =
                   ((local_44.value_ * -0x55555555 < 0x55555556) - 1 | 2) + local_44.value_;
            }
            if (local_44.value_ != 0xffffffff) {
              local_44.value_ =
                   (this->corner_table_->opposite_corners_).vector_.
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[local_44.value_].value_;
            }
            if (local_44.value_ != 0xffffffff) {
              local_44.value_ =
                   ((local_44.value_ * -0x55555555 < 0x55555556) - 1 | 2) + local_44.value_;
            }
          }
        }
        else {
          uVar6 = uVar1 - 2;
          if (0x55555555 < (uVar1 + 1) * -0x55555555) {
            uVar6 = uVar1 + 1;
          }
          uVar5 = 0xffffffff;
          if ((uVar6 != 0xffffffff) &&
             ((*(ulong *)((long)(this->is_edge_on_seam_).super__Bvector_base<std::allocator<bool>_>.
                                _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                _M_p + (ulong)(uVar6 >> 6) * 8) >> ((ulong)uVar6 & 0x3f) & 1) == 0))
          {
            uVar5 = (this->corner_table_->opposite_corners_).vector_.
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar6].value_;
          }
          local_44.value_ = uVar5;
          if (uVar5 != 0xffffffff) {
            local_44.value_ = uVar5 - 2;
            if (0x55555555 < (uVar5 + 1) * -0x55555555) {
              local_44.value_ = uVar5 + 1;
            }
          }
          do {
            uVar6 = local_44.value_;
            local_44.value_ = uVar6;
            if (uVar6 == 0xffffffff) goto LAB_0014ad43;
            uVar5 = uVar6 - 2;
            if (0x55555555 < (uVar6 + 1) * -0x55555555) {
              uVar5 = uVar6 + 1;
            }
            uVar7 = 0xffffffff;
            if ((uVar5 != 0xffffffff) &&
               ((*(ulong *)((long)(this->is_edge_on_seam_).
                                  super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           (ulong)(uVar5 >> 6) * 8) >> ((ulong)uVar5 & 0x3f) & 1) == 0)) {
              uVar7 = (this->corner_table_->opposite_corners_).vector_.
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar5].value_;
            }
            local_44.value_ = uVar7;
            if (uVar7 != 0xffffffff) {
              local_44.value_ = uVar7 - 2;
              if (0x55555555 < (uVar7 + 1) * -0x55555555) {
                local_44.value_ = uVar7 + 1;
              }
            }
            local_40.value_ = uVar6;
          } while (local_44.value_ != uVar1);
          bVar11 = true;
        }
      }
      if (bVar11) {
        return bVar12;
      }
      uVar10 = uVar10 + 1;
      pIVar8 = (this->corner_table_->vertex_corners_).vector_.
               super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar11 = uVar10 < ((ulong)((long)(this->corner_table_->vertex_corners_).vector_.
                                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar8) >>
                         2 & 0xffffffff);
      bVar12 = !bVar11;
    } while (bVar11);
  }
  return bVar12;
}

Assistant:

bool MeshAttributeCornerTable::RecomputeVerticesInternal(
    const Mesh *mesh, const PointAttribute *att) {
  DRACO_DCHECK(GetValenceCache().IsCacheEmpty());
  vertex_to_attribute_entry_id_map_.clear();
  vertex_to_left_most_corner_map_.clear();
  int num_new_vertices = 0;
  for (VertexIndex v(0); v < corner_table_->num_vertices(); ++v) {
    const CornerIndex c = corner_table_->LeftMostCorner(v);
    if (c == kInvalidCornerIndex) {
      continue;  // Isolated vertex?
    }
    AttributeValueIndex first_vert_id(num_new_vertices++);
    if (init_vertex_to_attribute_entry_map) {
      const PointIndex point_id = mesh->CornerToPointId(c.value());
      vertex_to_attribute_entry_id_map_.push_back(att->mapped_index(point_id));
    } else {
      // Identity mapping
      vertex_to_attribute_entry_id_map_.push_back(first_vert_id);
    }
    CornerIndex first_c = c;
    CornerIndex act_c;
    // Check if the vertex is on a seam edge, if it is we need to find the first
    // attribute entry on the seam edge when traversing in the CCW direction.
    if (is_vertex_on_seam_[v.value()]) {
      // Try to swing left on the modified corner table. We need to get the
      // first corner that defines an attribute seam.
      act_c = SwingLeft(first_c);
      while (act_c != kInvalidCornerIndex) {
        first_c = act_c;
        act_c = SwingLeft(act_c);
        if (act_c == c) {
          // We reached the initial corner which shouldn't happen when we swing
          // left from |c|.
          return false;
        }
      }
    }
    corner_to_vertex_map_[first_c.value()] = VertexIndex(first_vert_id.value());
    vertex_to_left_most_corner_map_.push_back(first_c);
    act_c = corner_table_->SwingRight(first_c);
    while (act_c != kInvalidCornerIndex && act_c != first_c) {
      if (IsCornerOppositeToSeamEdge(corner_table_->Next(act_c))) {
        first_vert_id = AttributeValueIndex(num_new_vertices++);
        if (init_vertex_to_attribute_entry_map) {
          const PointIndex point_id = mesh->CornerToPointId(act_c.value());
          vertex_to_attribute_entry_id_map_.push_back(
              att->mapped_index(point_id));
        } else {
          // Identity mapping.
          vertex_to_attribute_entry_id_map_.push_back(first_vert_id);
        }
        vertex_to_left_most_corner_map_.push_back(act_c);
      }
      corner_to_vertex_map_[act_c.value()] = VertexIndex(first_vert_id.value());
      act_c = corner_table_->SwingRight(act_c);
    }
  }
  return true;
}